

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLogging.cpp
# Opt level: O1

void Jinx::Impl::InitializeLogging(GlobalParams *params)

{
  Log::enableLogging = params->enableLogging;
  if (Log::enableLogging == true) {
    if ((params->logFn).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(Jinx::LogLevel,_const_char_*)>::operator=(&Log::logFn,&params->logFn);
    }
    Log::logSymbols = params->logSymbols;
    Log::logBytecode = params->logBytecode;
  }
  return;
}

Assistant:

inline_t void InitializeLogging(const GlobalParams & params)
	{
		Log::enableLogging = params.enableLogging;
		if (Log::enableLogging)
		{
			if (params.logFn)
				Log::logFn = params.logFn;
			Log::logSymbols = params.logSymbols;
			Log::logBytecode = params.logBytecode;
		}
	}